

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saxe-init.cc
# Opt level: O2

void cnn::OrthonormalRandom(uint dd,float g,Tensor *x)

{
  float *pfVar1;
  MatrixUType *src;
  ulong uVar2;
  ulong uVar3;
  result_type rVar4;
  initializer_list<unsigned_int> x_00;
  MatrixType local_2d0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_2b8;
  Tensor local_298;
  normal_distribution<float> local_250;
  JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2> svd;
  
  local_298.d.nd = 0;
  local_298.d.bd = 1;
  local_298.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  x_00._M_len = 2;
  x_00._M_array = (iterator)&svd;
  svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data._0_4_ = dd;
  svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data._4_4_ = dd;
  Dim::Dim(&local_298.d,x_00);
  uVar3 = (ulong)(dd * dd) << 2;
  pfVar1 = (float *)operator_new__(uVar3);
  local_250._M_param._M_mean = 0.0;
  local_250._M_param._M_stddev = 0.01;
  local_250._M_saved = 0.0;
  local_250._M_saved_available = false;
  local_298.v = pfVar1;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 4) {
    rVar4 = std::normal_distribution<float>::operator()(&local_250,rndeng);
    *(result_type *)((long)pfVar1 + uVar2) = rVar4;
  }
  Tensor::operator*(&local_2b8,&local_298);
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_2d0,
             (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_2b8);
  Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD(&svd,&local_2d0,4);
  free(local_2d0.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  src = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
                  (&svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_2>_>
                  );
  Tensor::operator*(&local_2b8,x);
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<float,_1,_1,0,_1,_1>>
            (&local_2b8,src);
  if (local_298.v != (float *)0x0) {
    operator_delete__(local_298.v);
  }
  Eigen::JacobiSVD<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&svd);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_298.bs);
  return;
}

Assistant:

void OrthonormalRandom(unsigned dd, float g, Tensor& x) {
  Tensor t;
  t.d = Dim({dd, dd});
  t.v = new float[dd * dd];
  normal_distribution<float> distribution(0, 0.01);
  auto b = [&] () {return distribution(*rndeng);};
  generate(t.v, t.v + dd*dd, b);
  Eigen::JacobiSVD<Eigen::MatrixXf> svd(*t, Eigen::ComputeFullU);
  *x = svd.matrixU();
  delete[] t.v;
}